

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aabox.hpp
# Opt level: O1

bool __thiscall AABox::intersect(AABox *this,Ray *r)

{
  AABox *pAVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar6 = *(float *)(r + 0xc);
  if (fVar6 <= 0.0) {
    fVar7 = *(float *)r;
    fVar3 = this->x2 - fVar7;
    pAVar1 = this;
  }
  else {
    fVar7 = *(float *)r;
    fVar3 = this->x1 - fVar7;
    pAVar1 = (AABox *)&this->x2;
  }
  fVar4 = (pAVar1->x1 - fVar7) / fVar6;
  fVar7 = *(float *)(r + 0x10);
  fVar3 = fVar3 / fVar6;
  fVar5 = ((&this->y1)[fVar7 <= 0.0] - *(float *)(r + 4)) / fVar7;
  fVar6 = fVar5;
  if (fVar5 <= fVar3) {
    fVar6 = fVar3;
  }
  fVar6 = (float)(~-(uint)NAN(fVar3) & (uint)fVar6 | -(uint)NAN(fVar3) & (uint)fVar5);
  fVar7 = ((&this->y1)[0.0 < fVar7] - *(float *)(r + 4)) / fVar7;
  fVar3 = fVar7;
  if (fVar4 <= fVar7) {
    fVar3 = fVar4;
  }
  fVar3 = (float)(~-(uint)NAN(fVar4) & (uint)fVar3 | -(uint)NAN(fVar4) & (uint)fVar7);
  fVar7 = *(float *)(r + 0x14);
  fVar5 = ((&this->z1)[fVar7 <= 0.0] - *(float *)(r + 8)) / fVar7;
  fVar4 = fVar5;
  if (fVar5 <= fVar6) {
    fVar4 = fVar6;
  }
  fVar7 = ((&this->z1)[0.0 < fVar7] - *(float *)(r + 8)) / fVar7;
  fVar2 = fVar7;
  if (fVar3 <= fVar7) {
    fVar2 = fVar3;
  }
  fVar7 = (float)(-(uint)NAN(fVar3) & (uint)fVar7 | ~-(uint)NAN(fVar3) & (uint)fVar2);
  return (bool)(-(0.0 < fVar7) &
                -((float)(-(uint)NAN(fVar6) & (uint)fVar5 | ~-(uint)NAN(fVar6) & (uint)fVar4) <=
                 fVar7) & 1);
}

Assistant:

bool intersect(const Ray& r)
	{
		float tmin, tmax;
		if (r.dir.x > 0)
			tmin = (x1 - r.origin.x) / r.dir.x,
			tmax = (x2 - r.origin.x) / r.dir.x;
		else
			tmin = (x2 - r.origin.x) / r.dir.x,
			tmax = (x1 - r.origin.x) / r.dir.x;
		if (r.dir.y > 0)
			tmin = fmax(tmin, (y1 - r.origin.y) / r.dir.y),
			tmax = fmin(tmax, (y2 - r.origin.y) / r.dir.y);
		else
			tmin = fmax(tmin, (y2 - r.origin.y) / r.dir.y),
			tmax = fmin(tmax, (y1 - r.origin.y) / r.dir.y);
		if (r.dir.z > 0)
			tmin = fmax(tmin, (z1 - r.origin.z) / r.dir.z),
			tmax = fmin(tmax, (z2 - r.origin.z) / r.dir.z);
		else
			tmin = fmax(tmin, (z2 - r.origin.z) / r.dir.z),
			tmax = fmin(tmax, (z1 - r.origin.z) / r.dir.z);
		return tmin <= tmax && tmax > 0;
	}